

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall MarrayTest::assignmentOperatorTest<false>(MarrayTest *this)

{
  allocator<int> *paVar1;
  undefined1 *puVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  reference piVar6;
  reference pvVar7;
  iterator iVar8;
  iterator iVar9;
  reference piVar10;
  bool local_1c99;
  bool local_1bf9;
  bool local_1b61;
  bool local_1ac1;
  bool local_1a29;
  bool local_1989;
  bool local_18f1;
  bool local_1899;
  bool local_1821;
  bool local_17c1;
  bool local_1761;
  bool local_1701;
  bool local_16a9;
  bool local_1651;
  bool local_15f9;
  bool local_15b1;
  bool local_1571;
  int local_1570;
  int local_156c;
  int z_3;
  int y_7;
  int x_9;
  int *m_address_3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1550;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1548;
  undefined1 local_1540 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_25;
  undefined1 local_14f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapen_9;
  undefined1 local_14c0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_12;
  undefined1 local_1478 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_11;
  undefined1 local_1448 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_24;
  undefined1 local_13f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapen_8;
  undefined1 local_13d8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_11;
  int local_1390;
  int local_138c;
  int z_2;
  int y_6;
  int x_8;
  int *n_address_3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1370;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1368;
  undefined1 local_1360 [8];
  Marray<int,_std::allocator<unsigned_long>_> n_12;
  undefined1 local_1310 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapen_7;
  undefined1 local_12e0 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_23;
  undefined1 local_1290 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_10;
  int scalar_3;
  undefined1 local_1260 [8];
  Marray<int,_std::allocator<unsigned_long>_> n_11;
  undefined1 local_1210 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapen_6;
  undefined1 local_11f0 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_22;
  int local_11a0;
  int y_5;
  int x_7;
  int *m_address_2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1188;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1180;
  undefined1 local_1178 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_21;
  undefined1 local_1128 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapen_5;
  undefined1 local_10f8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_10;
  undefined1 local_10b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_9;
  undefined1 local_1080 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_20;
  undefined1 local_1030 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapen_4;
  undefined1 local_1010 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_9;
  int local_fc8;
  int y_4;
  int x_6;
  int *n_address_2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_fb0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_fa8;
  undefined1 local_fa0 [8];
  Marray<int,_std::allocator<unsigned_long>_> n_10;
  undefined1 local_f50 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapen_3;
  undefined1 local_f20 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_19;
  undefined1 local_ed0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  int scalar_2;
  undefined1 local_ea0 [8];
  Marray<int,_std::allocator<unsigned_long>_> n_9;
  undefined1 local_e50 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapen_2;
  undefined1 local_e30 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_18;
  int local_de0;
  bool local_dda;
  bool local_dd9;
  int i_1;
  int *m_address_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_dc8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_dc0;
  undefined1 local_db8 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_17;
  undefined1 local_d68 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapem_1;
  undefined1 local_d38 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_8;
  undefined1 local_cf0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  undefined1 local_cc0 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_16;
  undefined1 local_c70 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapem;
  undefined1 local_c50 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_7;
  int local_c08;
  bool local_c02;
  bool local_c01;
  int x_5;
  int *n_address_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_bf0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_be8;
  undefined1 local_be0 [8];
  Marray<int,_std::allocator<unsigned_long>_> n_8;
  undefined1 local_b90 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapen_1;
  undefined1 local_b60 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_15;
  undefined1 local_b10 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  int scalar_1;
  undefined1 local_ae0 [8];
  Marray<int,_std::allocator<unsigned_long>_> n_7;
  undefined1 local_a90 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapen;
  undefined1 local_a70 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_14;
  int *m_address;
  undefined1 local_a10 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_13;
  undefined1 local_9c0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_6;
  undefined1 local_978 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_12;
  undefined1 local_928 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_5;
  int *n_address;
  undefined1 local_8d0 [8];
  Marray<int,_std::allocator<unsigned_long>_> n_6;
  undefined1 local_880 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_11;
  int scalar;
  Marray<int,_std::allocator<unsigned_long>_> n_5;
  undefined1 local_7e0 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_10;
  int local_790;
  int local_78c;
  int z_1;
  int y_3;
  int x_4;
  Marray<int,_std::allocator<unsigned_long>_> m_9;
  undefined1 local_720 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_6d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  int local_6b8;
  int y_2;
  int x_3;
  Marray<int,_std::allocator<unsigned_long>_> m_8;
  undefined1 local_650 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_608 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  int local_5e8;
  bool local_5e2;
  allocator<int> local_5e1;
  int i;
  Marray<int,_std::allocator<unsigned_long>_> m_7;
  undefined1 local_580 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_538 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  undefined1 local_518 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_6;
  undefined1 local_4c8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_480 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_5;
  undefined1 local_430 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  int local_3e8;
  int local_3e4;
  int z;
  int y_1;
  int x_2;
  Marray<int,_std::allocator<unsigned_long>_> n_4;
  undefined1 local_378 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_4;
  undefined1 local_328 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  int local_308;
  int y;
  int x_1;
  Marray<int,_std::allocator<unsigned_long>_> n_3;
  undefined1 local_2a0 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_3;
  undefined1 local_250 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  int local_230;
  bool local_22a;
  allocator<int> local_229;
  int x;
  Marray<int,_std::allocator<unsigned_long>_> n_2;
  undefined1 local_1c8 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_2;
  undefined1 local_178 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  undefined1 local_158 [8];
  Marray<int,_std::allocator<unsigned_long>_> n_1;
  undefined1 local_108 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_1;
  undefined1 local_b8 [8];
  Marray<int,_std::allocator<unsigned_long>_> n;
  allocator<int> local_59;
  undefined1 local_58 [8];
  Marray<int,_std::allocator<unsigned_long>_> m;
  MarrayTest *this_local;
  
  m._64_8_ = this;
  std::allocator<int>::allocator(&local_59);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_58,&local_59);
  std::allocator<int>::~allocator(&local_59);
  std::allocator<int>::allocator((allocator<int> *)&m_1.field_0x47);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_b8,
             (allocator_type *)&m_1.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_1.field_0x47);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_b8,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_58);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_b8);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_58);
  std::allocator<int>::allocator((allocator<int> *)&n_1.field_0x47);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_108,&this->scalar_,
             &andres::defaultOrder,(allocator_type *)&n_1.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&n_1.field_0x47);
  paVar1 = (allocator<int> *)
           ((long)&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_158,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_158,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_108);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_108);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_158);
  local_15b1 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_108);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_158);
    local_15b1 = false;
    if (sVar4 == sVar5) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_108,0);
      iVar3 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_158,0);
      local_15b1 = iVar3 == *piVar6;
    }
  }
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_15b1;
  test((bool *)((long)&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_158);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_108);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_2.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,1,
             (allocator_type *)&m_2.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_2.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,0);
  *pvVar7 = 0x18;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178);
  std::allocator<int>::allocator((allocator<int> *)&n_2.field_0x47);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_1c8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&n_2.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&n_2.field_0x47);
  std::allocator<int>::allocator(&local_229);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x,&local_229);
  std::allocator<int>::~allocator(&local_229);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_1c8);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x);
  local_15f9 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&x);
    local_15f9 = sVar4 == sVar5;
  }
  local_22a = local_15f9;
  test(&local_22a);
  for (local_230 = 0; local_230 < 0x18; local_230 = local_230 + 1) {
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_1c8,local_230);
    iVar3 = *piVar6;
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&x,local_230);
    shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = iVar3 == *piVar6;
    test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_1c8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_3.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,2,
             (allocator_type *)&m_3.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_3.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,0);
  *pvVar7 = 6;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,1);
  *pvVar7 = 4;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250);
  std::allocator<int>::allocator((allocator<int> *)&n_3.field_0x47);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_2a0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&n_3.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&n_3.field_0x47);
  std::allocator<int>::allocator((allocator<int> *)((long)&y + 3));
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_1,(allocator<int> *)((long)&y + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&y + 3));
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_1,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_2a0);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_2a0);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_1);
  local_1651 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_2a0);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_1);
    local_1651 = sVar4 == sVar5;
  }
  y._2_1_ = local_1651;
  test((bool *)((long)&y + 2));
  for (local_308 = 0; local_308 < 6; local_308 = local_308 + 1) {
    for (shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
        shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_2a0,(long)local_308
                          ,shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      iVar3 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&x_1,(long)local_308,
                          shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = iVar3 == *piVar6;
      test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_2a0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_4.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_328,3,
             (allocator_type *)&m_4.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_4.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_328,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_328,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_328,2);
  *pvVar7 = 2;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_328);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_328);
  std::allocator<int>::allocator((allocator<int> *)&n_4.field_0x47);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_378,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&n_4.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&n_4.field_0x47);
  std::allocator<int>::allocator((allocator<int> *)((long)&y_1 + 3));
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_2,(allocator<int> *)((long)&y_1 + 3))
  ;
  std::allocator<int>::~allocator((allocator<int> *)((long)&y_1 + 3));
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_2,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_378);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_378);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_2);
  local_16a9 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_378);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_2);
    local_16a9 = sVar4 == sVar5;
  }
  y_1._2_1_ = local_16a9;
  test((bool *)((long)&y_1 + 2));
  for (z = 0; z < 3; z = z + 1) {
    for (local_3e4 = 0; local_3e4 < 4; local_3e4 = local_3e4 + 1) {
      for (local_3e8 = 0; local_3e8 < 2; local_3e8 = local_3e8 + 1) {
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_378,(long)z,
                            local_3e4,local_3e8);
        iVar3 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&x_2,(long)z,local_3e4,
                            local_3e8);
        v.geometry_._55_1_ = iVar3 == *piVar6;
        test((bool *)&v.geometry_.field_0x37);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_2);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_378);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_328);
  std::allocator<int>::allocator((allocator<int> *)&m_5.field_0x47);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_430,
             (allocator_type *)&m_5.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_5.field_0x47);
  puVar2 = &v_1.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar2);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_480,(allocator_type *)puVar2);
  std::allocator<int>::~allocator((allocator<int> *)&v_1.geometry_.field_0x37);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_480,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_430);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_480);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_430);
  std::allocator<int>::allocator((allocator<int> *)&m_6.field_0x47);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4c8,&this->scalar_,
             (allocator_type *)&m_6.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_6.field_0x47);
  paVar1 = (allocator<int> *)
           ((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_518,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_518,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_4c8);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4c8);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_518);
  local_1701 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4c8);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_518);
    local_1701 = false;
    if (sVar4 == sVar5) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_4c8,0);
      iVar3 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_518,0);
      local_1701 = iVar3 == *piVar6;
    }
  }
  shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_1701;
  test((bool *)((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_518);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4c8);
  puVar2 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_538,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_538,0);
  *pvVar7 = 0x18;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_538);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_538);
  std::allocator<int>::allocator((allocator<int> *)&m_7.field_0x47);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_580,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m_7.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_7.field_0x47);
  std::allocator<int>::allocator(&local_5e1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&i,&local_5e1);
  std::allocator<int>::~allocator(&local_5e1);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&i,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_580);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_580);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&i);
  local_1761 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_580);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&i);
    local_1761 = sVar4 == sVar5;
  }
  local_5e2 = local_1761;
  test(&local_5e2);
  for (local_5e8 = 0; local_5e8 < 0x18; local_5e8 = local_5e8 + 1) {
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_580,local_5e8);
    iVar3 = *piVar6;
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&i,local_5e8);
    shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = iVar3 == *piVar6;
    test((bool *)((long)&shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&i);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_580);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_538);
  puVar2 = &v_3.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_608,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_3.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_608,0);
  *pvVar7 = 6;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_608,1);
  *pvVar7 = 4;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_608);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_608);
  std::allocator<int>::allocator((allocator<int> *)&m_8.field_0x47);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_650,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m_8.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_8.field_0x47);
  std::allocator<int>::allocator((allocator<int> *)((long)&y_2 + 3));
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_3,(allocator<int> *)((long)&y_2 + 3))
  ;
  std::allocator<int>::~allocator((allocator<int> *)((long)&y_2 + 3));
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&x_3,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_650);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_650);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_3);
  local_17c1 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_650);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_3);
    local_17c1 = sVar4 == sVar5;
  }
  y_2._2_1_ = local_17c1;
  test((bool *)((long)&y_2 + 2));
  for (local_6b8 = 0; local_6b8 < 6; local_6b8 = local_6b8 + 1) {
    for (shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
        shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_650,(long)local_6b8
                          ,shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      iVar3 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&x_3,(long)local_6b8,
                          shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = iVar3 == *piVar6;
      test((bool *)((long)&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_3);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_650);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_608);
  puVar2 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6d8,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6d8,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6d8,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6d8,2);
  *pvVar7 = 2;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6d8);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6d8);
  std::allocator<int>::allocator((allocator<int> *)&m_9.field_0x47);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_720,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m_9.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_9.field_0x47);
  std::allocator<int>::allocator((allocator<int> *)((long)&y_3 + 3));
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_4,(allocator<int> *)((long)&y_3 + 3))
  ;
  std::allocator<int>::~allocator((allocator<int> *)((long)&y_3 + 3));
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&x_4,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_720);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_720);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_4);
  local_1821 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_720);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_4);
    local_1821 = sVar4 == sVar5;
  }
  y_3._2_1_ = local_1821;
  test((bool *)((long)&y_3 + 2));
  for (z_1 = 0; z_1 < 3; z_1 = z_1 + 1) {
    for (local_78c = 0; local_78c < 4; local_78c = local_78c + 1) {
      for (local_790 = 0; local_790 < 2; local_790 = local_790 + 1) {
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_720,(long)z_1,
                            local_78c,local_790);
        iVar3 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&x_4,(long)z_1,
                            local_78c,local_790);
        m_10._71_1_ = iVar3 == *piVar6;
        test((bool *)&m_10.field_0x47);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_4);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_720);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6d8);
  std::allocator<int>::allocator((allocator<int> *)&n_5.field_0x47);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_7e0,
             (allocator_type *)&n_5.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&n_5.field_0x47);
  std::allocator<int>::allocator((allocator<int> *)&m_11.field_0x47);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&scalar,&this->scalar_,
             &andres::defaultOrder,(allocator_type *)&m_11.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_11.field_0x47);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)&scalar,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_7e0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&scalar);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_7e0);
  m_11._64_4_ = 2;
  std::allocator<int>::allocator((allocator<int> *)&n_6.field_0x47);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_880,(int *)&m_11.field_0x40,
             &andres::defaultOrder,(allocator_type *)&n_6.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&n_6.field_0x47);
  std::allocator<int>::allocator((allocator<int> *)((long)&n_address + 7));
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_8d0,&this->scalar_,
             &andres::defaultOrder,(allocator<int> *)((long)&n_address + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&n_address + 7));
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_8d0,0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_8d0,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_880);
  piVar10 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                      ((View<int,false,std::allocator<unsigned_long>> *)local_8d0,0);
  v_5.geometry_._55_1_ = piVar10 == piVar6;
  test((bool *)&v_5.geometry_.field_0x37);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_880);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8d0);
  local_1899 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_880);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8d0);
    local_1899 = false;
    if (sVar4 == sVar5) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_880,0);
      iVar3 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_8d0,0);
      local_1899 = iVar3 == *piVar6;
    }
  }
  v_5.geometry_._54_1_ = local_1899;
  test((bool *)&v_5.geometry_.field_0x36);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_8d0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_880);
  std::allocator<int>::allocator((allocator<int> *)&m_12.field_0x47);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_928,
             (allocator_type *)&m_12.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_12.field_0x47);
  puVar2 = &v_6.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar2);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_978,&this->scalar_,
             &andres::defaultOrder,(allocator_type *)puVar2);
  std::allocator<int>::~allocator((allocator<int> *)&v_6.geometry_.field_0x37);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_978,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_928);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_978);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_928);
  std::allocator<int>::allocator((allocator<int> *)&m_13.field_0x47);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9c0,&this->scalar_,
             (allocator_type *)&m_13.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_13.field_0x47);
  std::allocator<int>::allocator((allocator<int> *)((long)&m_address + 7));
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_a10,&this->scalar_,
             &andres::defaultOrder,(allocator<int> *)((long)&m_address + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&m_address + 7));
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_a10,0);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_a10,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_9c0);
  piVar10 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                      ((View<int,false,std::allocator<unsigned_long>> *)local_a10,0);
  m_14._71_1_ = piVar10 == piVar6;
  test((bool *)&m_14.field_0x47);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9c0);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a10);
  local_18f1 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9c0);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a10);
    local_18f1 = false;
    if (sVar4 == sVar5) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_9c0,0);
      iVar3 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_a10,0);
      local_18f1 = iVar3 == *piVar6;
    }
  }
  m_14._70_1_ = local_18f1;
  test((bool *)&m_14.field_0x46);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_a10);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9c0);
  paVar1 = (allocator<int> *)
           ((long)&shapen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_a70,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shapen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&n_7.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a90,1,
             (allocator_type *)&n_7.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&n_7.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a90,0);
  *pvVar7 = 0x18;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a90);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a90);
  paVar1 = (allocator<int> *)
           ((long)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_ae0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,&this->scalar_,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_ae0,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_a70);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_ae0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a90);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_a70);
  shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_15.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b10,1,
             (allocator_type *)&m_15.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_15.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b10,0);
  *pvVar7 = 0x18;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b10);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b10);
  paVar1 = (allocator<int> *)
           ((long)&shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_b60,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,
             (int *)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,&andres::defaultOrder,paVar1)
  ;
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shapen_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&n_8.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b90,1,
             (allocator_type *)&n_8.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&n_8.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b90,0);
  *pvVar7 = 0x18;
  local_be8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b90);
  local_bf0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b90);
  std::allocator<int>::allocator((allocator<int> *)((long)&n_address_1 + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_be0,local_be8,local_bf0,
             &this->scalar_,&andres::defaultOrder,(allocator<int> *)((long)&n_address_1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&n_address_1 + 7));
  _x_5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                   ((View<int,false,std::allocator<unsigned_long>> *)local_be0,0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_be0,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_b60);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_be0,0);
  local_c01 = piVar6 == _x_5;
  test(&local_c01);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b60);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_be0);
  local_1989 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b60);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_be0);
    local_1989 = sVar4 == sVar5;
  }
  local_c02 = local_1989;
  test(&local_c02);
  for (local_c08 = 0; local_c08 < 0x18; local_c08 = local_c08 + 1) {
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_b60,local_c08);
    iVar3 = *piVar6;
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_be0,local_c08);
    v_7.geometry_._55_1_ = iVar3 == *piVar6;
    test((bool *)&v_7.geometry_.field_0x37);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_be0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b90);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_b60);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b10);
  paVar1 = (allocator<int> *)
           ((long)&shapem.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c50,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shapem.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_16.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c70,1,
             (allocator_type *)&m_16.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_16.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c70,0);
  *pvVar7 = 0x18;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c70);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c70);
  paVar1 = (allocator<int> *)
           ((long)&shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_cc0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,&this->scalar_,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_cc0,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_c50);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_cc0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c70);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c50);
  puVar2 = &v_8.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cf0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_8.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cf0,0);
  *pvVar7 = 0x18;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cf0);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cf0);
  paVar1 = (allocator<int> *)
           ((long)&shapem_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_d38,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shapem_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_17.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d68,1,
             (allocator_type *)&m_17.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_17.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d68,0);
  *pvVar7 = 0x18;
  local_dc0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d68);
  local_dc8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d68);
  std::allocator<int>::allocator((allocator<int> *)((long)&m_address_1 + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_db8,local_dc0,local_dc8,
             &this->scalar_,&andres::defaultOrder,(allocator<int> *)((long)&m_address_1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&m_address_1 + 7));
  _i_1 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                   ((View<int,false,std::allocator<unsigned_long>> *)local_db8,0);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_db8,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_d38);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_db8,0);
  local_dd9 = piVar6 == _i_1;
  test(&local_dd9);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d38);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_db8);
  local_1a29 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d38);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_db8);
    local_1a29 = sVar4 == sVar5;
  }
  local_dda = local_1a29;
  test(&local_dda);
  for (local_de0 = 0; local_de0 < 0x18; local_de0 = local_de0 + 1) {
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_d38,local_de0);
    iVar3 = *piVar6;
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_db8,local_de0);
    m_18._71_1_ = iVar3 == *piVar6;
    test((bool *)&m_18.field_0x47);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_db8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d68);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d38);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cf0);
  paVar1 = (allocator<int> *)
           ((long)&shapen_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_e30,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shapen_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&n_9.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e50,2,
             (allocator_type *)&n_9.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&n_9.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e50,0);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e50,1);
  *pvVar7 = 6;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e50);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e50);
  paVar1 = (allocator<int> *)
           ((long)&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_ea0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,&this->scalar_,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_ea0,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_e30);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_ea0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e50);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_e30);
  shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_19.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0,2,
             (allocator_type *)&m_19.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_19.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0,0);
  *pvVar7 = 6;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0,1);
  *pvVar7 = 4;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0);
  paVar1 = (allocator<int> *)
           ((long)&shapen_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_f20,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,
             (int *)&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,&andres::defaultOrder,paVar1)
  ;
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shapen_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&n_10.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f50,2,
             (allocator_type *)&n_10.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&n_10.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f50,0);
  *pvVar7 = 6;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f50,1);
  *pvVar7 = 4;
  local_fa8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f50);
  local_fb0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f50);
  std::allocator<int>::allocator((allocator<int> *)((long)&n_address_2 + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_fa0,local_fa8,local_fb0,
             &this->scalar_,&andres::defaultOrder,(allocator<int> *)((long)&n_address_2 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&n_address_2 + 7));
  _x_6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                   ((View<int,false,std::allocator<unsigned_long>> *)local_fa0,0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_fa0,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_f20);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_fa0,0);
  y_4._3_1_ = piVar6 == _x_6;
  test((bool *)((long)&y_4 + 3));
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f20);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_fa0);
  local_1ac1 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f20);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_fa0);
    local_1ac1 = sVar4 == sVar5;
  }
  y_4._2_1_ = local_1ac1;
  test((bool *)((long)&y_4 + 2));
  for (local_fc8 = 0; local_fc8 < 6; local_fc8 = local_fc8 + 1) {
    v_9.geometry_.isSimple_ = false;
    v_9.geometry_._53_3_ = 0;
    for (; (int)v_9.geometry_._52_4_ < 4; v_9.geometry_._52_4_ = v_9.geometry_._52_4_ + 1) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_f20,(long)local_fc8
                          ,v_9.geometry_._52_4_);
      iVar3 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_fa0,(long)local_fc8
                          ,v_9.geometry_._52_4_);
      v_9.geometry_.coordinateOrder_._3_1_ = iVar3 == *piVar6;
      test((bool *)((long)&v_9.geometry_.coordinateOrder_ + 3));
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_fa0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f50);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_f20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0);
  paVar1 = (allocator<int> *)
           ((long)&shapen_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1010,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shapen_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_20.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1030,2,
             (allocator_type *)&m_20.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_20.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1030,0);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1030,1);
  *pvVar7 = 6;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1030);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1030);
  paVar1 = (allocator<int> *)
           ((long)&shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_1080,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,&this->scalar_,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_1080,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_1010);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_1080);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1030);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1010);
  puVar2 = &v_10.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10b0,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_10.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10b0,0);
  *pvVar7 = 6;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10b0,1);
  *pvVar7 = 4;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10b0);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10b0);
  paVar1 = (allocator<int> *)
           ((long)&shapen_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_10f8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shapen_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_21.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1128,2,
             (allocator_type *)&m_21.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_21.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1128,0);
  *pvVar7 = 6;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1128,1);
  *pvVar7 = 4;
  local_1180._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1128);
  local_1188._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1128);
  std::allocator<int>::allocator((allocator<int> *)((long)&m_address_2 + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_1178,local_1180,local_1188,
             &this->scalar_,&andres::defaultOrder,(allocator<int> *)((long)&m_address_2 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&m_address_2 + 7));
  _x_7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                   ((View<int,false,std::allocator<unsigned_long>> *)local_1178,0);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_1178,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_10f8);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_1178,0);
  y_5._3_1_ = piVar6 == _x_7;
  test((bool *)((long)&y_5 + 3));
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_10f8);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1178);
  local_1b61 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_10f8);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1178);
    local_1b61 = sVar4 == sVar5;
  }
  y_5._2_1_ = local_1b61;
  test((bool *)((long)&y_5 + 2));
  for (local_11a0 = 0; local_11a0 < 6; local_11a0 = local_11a0 + 1) {
    for (m_22._68_4_ = 0; (int)m_22._68_4_ < 4; m_22._68_4_ = m_22._68_4_ + 1) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_10f8,
                          (long)local_11a0,m_22._68_4_);
      iVar3 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_1178,
                          (long)local_11a0,m_22._68_4_);
      m_22._67_1_ = iVar3 == *piVar6;
      test((bool *)&m_22.field_0x43);
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_1178);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1128);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_10f8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10b0);
  paVar1 = (allocator<int> *)
           ((long)&shapen_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_11f0,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shapen_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&n_11.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1210,3,
             (allocator_type *)&n_11.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&n_11.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1210,0);
  *pvVar7 = 2;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1210,1);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1210,2);
  *pvVar7 = 4;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1210);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1210);
  paVar1 = (allocator<int> *)
           ((long)&shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_1260,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,&this->scalar_,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_1260,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_11f0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_1260);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1210);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_11f0);
  shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_23.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1290,3,
             (allocator_type *)&m_23.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_23.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1290,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1290,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1290,2);
  *pvVar7 = 2;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1290);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1290);
  paVar1 = (allocator<int> *)
           ((long)&shapen_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_12e0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,
             (int *)&shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,&andres::defaultOrder,paVar1)
  ;
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shapen_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&n_12.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1310,3,
             (allocator_type *)&n_12.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&n_12.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1310,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1310,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1310,2);
  *pvVar7 = 2;
  local_1368._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1310);
  local_1370._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1310);
  std::allocator<int>::allocator((allocator<int> *)((long)&n_address_3 + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_1360,local_1368,local_1370,
             &this->scalar_,&andres::defaultOrder,(allocator<int> *)((long)&n_address_3 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&n_address_3 + 7));
  _x_8 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                   ((View<int,false,std::allocator<unsigned_long>> *)local_1360,0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_1360,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_12e0);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_1360,0);
  y_6._3_1_ = piVar6 == _x_8;
  test((bool *)((long)&y_6 + 3));
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_12e0);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1360);
  local_1bf9 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_12e0);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1360);
    local_1bf9 = sVar4 == sVar5;
  }
  y_6._2_1_ = local_1bf9;
  test((bool *)((long)&y_6 + 2));
  for (z_2 = 0; z_2 < 3; z_2 = z_2 + 1) {
    for (local_138c = 0; local_138c < 4; local_138c = local_138c + 1) {
      for (local_1390 = 0; local_1390 < 2; local_1390 = local_1390 + 1) {
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_12e0,(long)z_2,
                            local_138c,local_1390);
        iVar3 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_1360,(long)z_2,
                            local_138c,local_1390);
        v_11.geometry_._55_1_ = iVar3 == *piVar6;
        test((bool *)&v_11.geometry_.field_0x37);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_1360);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1310);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_12e0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1290);
  paVar1 = (allocator<int> *)
           ((long)&shapen_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_13d8,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shapen_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_24.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13f8,3,
             (allocator_type *)&m_24.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_24.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13f8,0);
  *pvVar7 = 2;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13f8,1);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13f8,2);
  *pvVar7 = 4;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13f8);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13f8);
  paVar1 = (allocator<int> *)
           ((long)&shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_1448,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,&this->scalar_,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_1448,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_13d8);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_1448);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_13f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_13d8);
  puVar2 = &v_12.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1478,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_12.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1478,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1478,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1478,2);
  *pvVar7 = 2;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1478);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1478);
  paVar1 = (allocator<int> *)
           ((long)&shapen_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_14c0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shapen_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_25.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_14f0,3,
             (allocator_type *)&m_25.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_25.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_14f0,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_14f0,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_14f0,2);
  *pvVar7 = 2;
  local_1548._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_14f0);
  local_1550._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_14f0);
  std::allocator<int>::allocator((allocator<int> *)((long)&m_address_3 + 7));
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_1540,local_1548,local_1550,
             &this->scalar_,&andres::defaultOrder,(allocator<int> *)((long)&m_address_3 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&m_address_3 + 7));
  _x_9 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                   ((View<int,false,std::allocator<unsigned_long>> *)local_1540,0);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_1540,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_14c0);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_1540,0);
  y_7._3_1_ = piVar6 == _x_9;
  test((bool *)((long)&y_7 + 3));
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_14c0);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1540);
  local_1c99 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_14c0);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1540);
    local_1c99 = sVar4 == sVar5;
  }
  y_7._2_1_ = local_1c99;
  test((bool *)((long)&y_7 + 2));
  for (z_3 = 0; z_3 < 3; z_3 = z_3 + 1) {
    for (local_156c = 0; local_156c < 4; local_156c = local_156c + 1) {
      for (local_1570 = 0; local_1570 < 2; local_1570 = local_1570 + 1) {
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_14c0,(long)z_3,
                            local_156c,local_1570);
        iVar3 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_1540,(long)z_3,
                            local_156c,local_1570);
        local_1571 = iVar3 == *piVar6;
        test(&local_1571);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_1540);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_14f0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_14c0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1478);
  return;
}

Assistant:

void MarrayTest::assignmentOperatorTest(){
    // empty
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                andres::Marray<int> n;
                n = m;
            }
            // scalar
            {
                andres::Marray<int> m(scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.dimension() == n.dimension() &&
                       m.size() == n.size() &&
                       m(0) == n(0));
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 24; ++x)
                    test(m(x)==n(x));
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);

                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(m(x, y)==n(x, y));
                }
            }
            // 3D 
            {
                std::vector<std::size_t> shape(3); 
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(m(x, y, z)==n(x, y, z));
                    }
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                andres::Marray<int> m;
                m = v;
            }
            // scalar
            {
                andres::View<int, constTarget> v(&scalar_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() &&
                       v.dimension()==m.dimension() &&
                       v(0)==m(0));
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;
                
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
            // 3D
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() &&
                       v.dimension()==m.dimension());
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(v(x, y, z)==m(x, y, z));
                    }
                }
            }
        }
    }
    // scalar
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                andres::Marray<int> n(scalar_);
                n = m;
            }
            // scalar
            {
                int scalar = 2;
                andres::Marray<int> m(scalar);
                andres::Marray<int> n(scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.dimension() == n.dimension() &&
                       m.size() == n.size() &&
                       m(0) == n(0));
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                andres::Marray<int> m(scalar_);
                m = v;
            }
            // scalar
            {
                andres::View<int, constTarget> v(&scalar_);
                andres::Marray<int> m(scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address);
                test(v.size()==m.size() &&
                       v.dimension()==m.dimension() &&
                       v(0)==m(0));
            }
        }
    }
    // 1D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(1);
                shapen[0] = 24;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 1D
            {
                int scalar = 2;
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(1);
                shapen[0] = 24;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address
                );
                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 24; ++x)
                    test(m(x)==n(x));
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapem(1);
                shapem[0] = 24;
                andres::Marray<int> m(shapem.begin(), shapem.end(), scalar_);
                m = v;
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapem(1);
                shapem[0] = 24;
                andres::Marray<int> m(shapem.begin(), shapem.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address
                );
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
        }
    }
    // 2D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(2);
                shapen[0] = 4;
                shapen[1] = 6;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 2D
            {
                int scalar = 2;
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(2);
                shapen[0] = 6;
                shapen[1] = 4;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.size()==n.size() && m.dimension()==n.dimension());
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(m(x, y)==n(x, y));
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapen(2);
                shapen[0] = 4;
                shapen[1] = 6;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                m = v;
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapen(2);
                shapen[0] = 6;
                shapen[1] = 4;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address);
                test(v.size()==m.size() && v.dimension()==m.dimension());
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
        }
    }
    // 3D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(3);
                shapen[0] = 2;
                shapen[1] = 3;
                shapen[2] = 4;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 3D 
            {
                int scalar = 2;
                std::vector<std::size_t> shape(3); 
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(3);
                shapen[0] = 3;
                shapen[1] = 4;
                shapen[2] = 2;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.size()==n.size() && m.dimension()==n.dimension());
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(m(x, y, z)==n(x, y, z));
                    }
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapen(3);
                shapen[0] = 2;
                shapen[1] = 3;
                shapen[2] = 4;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                m = v;
            }
            // 3D
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapen(3);
                shapen[0] = 3;
                shapen[1] = 4;
                shapen[2] = 2;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address
                );
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(v(x, y, z)==m(x, y, z));
                    }
                }
            }
        }
    }
}